

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O2

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeTriang>::~TPZCompElHCurl
          (TPZCompElHCurl<pzshape::TPZShapeTriang> *this)

{
  ~TPZCompElHCurl((TPZCompElHCurl<pzshape::TPZShapeTriang> *)
                  ((long)(this->fConnectIndexes).fExtAlloc +
                  *(long *)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                      super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                      super_TPZCompEl + -0x20) + -0x68));
  return;
}

Assistant:

TPZCompElHCurl<TSHAPE>::~TPZCompElHCurl(){
    TPZGeoEl *gel = this->Reference();
    if (gel && gel->Reference() != this) {
        return;
    }
    if (gel) {
        TPZCompEl *cel = gel->Reference();
        if (cel == this) {
            this->RemoveSideRestraintsII(TPZInterpolatedElement::MInsertMode::EDelete);
        }
        this->Reference()->ResetReference();
    }
    TPZStack<int64_t > connectlist;
    this->BuildConnectList(connectlist);
    int64_t nconnects = connectlist.size();
    for (int ic = 0; ic < nconnects; ic++) {
        if (connectlist[ic] != -1){
            this->fMesh->ConnectVec()[connectlist[ic]].DecrementElConnected();
        }
    }
    if (gel){
        gel->ResetReference();
    }
}